

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall capnp::MallocMessageBuilder::~MallocMessageBuilder(MallocMessageBuilder *this)

{
  void *__s;
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  word *pwVar3;
  void **ppvVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  void *ptr;
  void **__end2;
  void **__begin2;
  Vector<void_*> *__range2;
  Fault f;
  undefined1 local_20 [8];
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  MallocMessageBuilder *this_local;
  
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_003a5448;
  segments.size_ = (size_t)this;
  if ((this->returnedFirstSegment & 1U) != 0) {
    if ((this->ownFirstSegment & 1U) == 0) {
      AVar5 = MessageBuilder::getSegmentsForOutput(&this->super_MessageBuilder);
      segments.ptr = (ArrayPtr<const_capnp::word> *)AVar5.size_;
      local_20 = (undefined1  [8])AVar5.ptr;
      sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)local_20);
      if (sVar1 != 0) {
        pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                           ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)local_20,0);
        pwVar3 = kj::ArrayPtr<const_capnp::word>::begin(pAVar2);
        if (pwVar3 != (word *)this->firstSegment) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                    ((Fault *)&__range2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
                     ,0xe0,FAILED,"segments[0].begin() == firstSegment",
                     "\"First segment in getSegmentsForOutput() is not the first segment allocated?\""
                     ,(char (*) [76])
                      "First segment in getSegmentsForOutput() is not the first segment allocated?")
          ;
          kj::_::Debug::Fault::fatal((Fault *)&__range2);
        }
        __s = this->firstSegment;
        pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                           ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)local_20,0);
        sVar1 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
        memset(__s,0,sVar1 << 3);
      }
    }
    else {
      free(this->firstSegment);
    }
    __end2 = kj::Vector<void_*>::begin(&this->moreSegments);
    ppvVar4 = kj::Vector<void_*>::end(&this->moreSegments);
    for (; __end2 != ppvVar4; __end2 = __end2 + 1) {
      free(*__end2);
    }
  }
  kj::Vector<void_*>::~Vector(&this->moreSegments);
  MessageBuilder::~MessageBuilder(&this->super_MessageBuilder);
  return;
}

Assistant:

MallocMessageBuilder::~MallocMessageBuilder() noexcept(false) {
  if (returnedFirstSegment) {
    if (ownFirstSegment) {
      free(firstSegment);
    } else {
      // Must zero first segment.
      kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = getSegmentsForOutput();
      if (segments.size() > 0) {
        KJ_ASSERT(segments[0].begin() == firstSegment,
            "First segment in getSegmentsForOutput() is not the first segment allocated?");
        memset(firstSegment, 0, segments[0].size() * sizeof(word));
      }
    }

    for (void* ptr: moreSegments) {
      free(ptr);
    }
  }
}